

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O1

void __thiscall UDMFParser::AddUserKey(UDMFParser *this,FName *key,int kind,int index)

{
  int iVar1;
  uint uVar2;
  Node *pNVar3;
  FUDMFKeys *this_00;
  FUDMFKey *this_01;
  double dVar4;
  FUDMFKey local_40;
  
  pNVar3 = TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::GetNode
                     (UDMFKeys + kind,index);
  uVar2 = (pNVar3->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count;
  this_00 = &(pNVar3->Pair).Value;
  if (uVar2 != 0) {
    this_01 = (this_00->super_TArray<FUDMFKey,_FUDMFKey>).Array;
    do {
      if ((this_01->Key).Index == key->Index) {
        iVar1 = (this->super_UDMFParserBase).sc.TokenType;
        if (iVar1 < 0x14b) {
          if (iVar1 == 0x104) {
            iVar1 = (this->super_UDMFParserBase).sc.Number;
            this_01->Type = 0;
            this_01->IntVal = iVar1;
            dVar4 = (double)iVar1;
          }
          else {
            if (iVar1 != 0x106) {
LAB_00554f5d:
              FUDMFKey::operator=(this_01,&(this->super_UDMFParserBase).parsedString);
              return;
            }
            dVar4 = (this->super_UDMFParserBase).sc.Float;
            this_01->Type = 1;
            this_01->IntVal = (int)dVar4;
          }
          this_01->FloatVal = dVar4;
        }
        else {
          if (iVar1 == 0x14b) {
            this_01->Type = 0;
            this_01->IntVal = 1;
            dVar4 = 1.0;
          }
          else {
            if (iVar1 != 0x14c) goto LAB_00554f5d;
            dVar4 = 0.0;
            this_01->Type = 0;
            this_01->IntVal = 0;
          }
          this_01->FloatVal = dVar4;
        }
        FString::operator=(&this_01->StringVal,(char *)"");
        return;
      }
      this_01 = this_01 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  local_40.StringVal.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_40.Key = (FName)key->Index;
  iVar1 = (this->super_UDMFParserBase).sc.TokenType;
  if (iVar1 < 0x14b) {
    if (iVar1 == 0x104) {
      uVar2 = (this->super_UDMFParserBase).sc.Number;
      local_40._4_8_ = (ulong)uVar2 << 0x20;
      local_40.FloatVal = (double)(int)uVar2;
    }
    else {
      if (iVar1 != 0x106) {
LAB_00554ee4:
        FUDMFKey::operator=(&local_40,&(this->super_UDMFParserBase).parsedString);
        goto LAB_00554f3c;
      }
      local_40.FloatVal = (this->super_UDMFParserBase).sc.Float;
      local_40.IntVal = (int)local_40.FloatVal;
      local_40.Type = 1;
    }
  }
  else if (iVar1 == 0x14b) {
    local_40.Type = 0;
    local_40.IntVal = 1;
    local_40.FloatVal = 1.0;
  }
  else {
    if (iVar1 != 0x14c) goto LAB_00554ee4;
    local_40.Type = 0;
    local_40.IntVal = 0;
    local_40.FloatVal = 0.0;
  }
  FString::operator=(&local_40.StringVal,(char *)"");
LAB_00554f3c:
  TArray<FUDMFKey,_FUDMFKey>::Push(&this_00->super_TArray<FUDMFKey,_FUDMFKey>,&local_40);
  FString::~FString(&local_40.StringVal);
  return;
}

Assistant:

void AddUserKey(FName key, int kind, int index)
	{
		FUDMFKeys &keyarray = UDMFKeys[kind][index];

		for(unsigned i=0; i < keyarray.Size(); i++)
		{
			if (keyarray[i].Key == key)
			{
				switch (sc.TokenType)
				{
				case TK_IntConst:
					keyarray[i] = sc.Number;
					break;
				case TK_FloatConst:
					keyarray[i] = sc.Float;
					break;
				default:
				case TK_StringConst:
					keyarray[i] = parsedString;
					break;
				case TK_True:
					keyarray[i] = 1;
					break;
				case TK_False:
					keyarray[i] = 0;
					break;
				}
				return;
			}
		}
		FUDMFKey ukey;
		ukey.Key = key;
		switch (sc.TokenType)
		{
		case TK_IntConst:
			ukey = sc.Number;
			break;
		case TK_FloatConst:
			ukey = sc.Float;
			break;
		default:
		case TK_StringConst:
			ukey = parsedString;
			break;
		case TK_True:
			ukey = 1;
			break;
		case TK_False:
			ukey = 0;
			break;
		}
		keyarray.Push(ukey);
	}